

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

htmlDocPtr htmlSAXParseFile(char *filename,char *encoding,htmlSAXHandlerPtr sax,void *userData)

{
  htmlParserCtxtPtr ctxt;
  xmlDocPtr pxVar1;
  _xmlSAXHandler *p_Var2;
  
  xmlInitParser();
  ctxt = htmlCreateFileParserCtxt(filename,encoding);
  if (ctxt == (htmlParserCtxtPtr)0x0) {
    pxVar1 = (xmlDocPtr)0x0;
  }
  else {
    if (sax == (htmlSAXHandlerPtr)0x0) {
      p_Var2 = (_xmlSAXHandler *)0x0;
    }
    else {
      p_Var2 = ctxt->sax;
      ctxt->sax = sax;
      ctxt->userData = userData;
    }
    htmlParseDocument(ctxt);
    if (sax != (htmlSAXHandlerPtr)0x0) {
      ctxt->sax = p_Var2;
      ctxt->userData = (void *)0x0;
    }
    pxVar1 = ctxt->myDoc;
    xmlFreeParserCtxt(ctxt);
  }
  return pxVar1;
}

Assistant:

htmlDocPtr
htmlSAXParseFile(const char *filename, const char *encoding, htmlSAXHandlerPtr sax,
                 void *userData) {
    htmlDocPtr ret;
    htmlParserCtxtPtr ctxt;
    htmlSAXHandlerPtr oldsax = NULL;

    xmlInitParser();

    ctxt = htmlCreateFileParserCtxt(filename, encoding);
    if (ctxt == NULL) return(NULL);
    if (sax != NULL) {
	oldsax = ctxt->sax;
        ctxt->sax = sax;
        ctxt->userData = userData;
    }

    htmlParseDocument(ctxt);

    ret = ctxt->myDoc;
    if (sax != NULL) {
        ctxt->sax = oldsax;
        ctxt->userData = NULL;
    }
    htmlFreeParserCtxt(ctxt);

    return(ret);
}